

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O0

bool __thiscall capnp::_::ListBuilder::getDataElement<bool>(ListBuilder *this,ElementCount index)

{
  byte bVar1;
  uint uVar2;
  byte *b;
  uint bindex;
  ElementCount index_local;
  ListBuilder *this_local;
  
  bVar1 = this->ptr[index >> 3];
  uVar2 = unbound<unsigned_int>(1 << ((byte)index & 7));
  return (bVar1 & uVar2) != 0;
}

Assistant:

inline bool ListBuilder::getDataElement<bool>(ElementCount index) {
  // Ignore step for bit lists because bit lists cannot be upgraded to struct lists.
  auto bindex = index * (ONE * BITS / ELEMENTS);
  byte* b = ptr + bindex / BITS_PER_BYTE;
  return (*reinterpret_cast<uint8_t*>(b) &
      unbound(ONE << (bindex % BITS_PER_BYTE / BITS))) != 0;
}